

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sum_squares_sse2.c
# Opt level: O2

uint64_t aom_sum_sse_2d_i16_nxn_sse2(int16_t *src,int stride,int width,int height,int *sum)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 (*pauVar4) [16];
  int iVar5;
  int c;
  long lVar6;
  long lVar7;
  long lVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  uint uVar13;
  uint uVar15;
  uint uVar16;
  undefined1 auVar14 [16];
  uint uVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  
  iVar5 = 0;
  iVar9 = 0;
  iVar10 = 0;
  iVar11 = 0;
  iVar12 = 0;
  lVar7 = 0;
  lVar8 = 0;
  do {
    lVar6 = 0;
    uVar13 = 0;
    uVar15 = 0;
    uVar16 = 0;
    uVar17 = 0;
    pauVar4 = (undefined1 (*) [16])src;
    do {
      auVar18 = *pauVar4;
      auVar1 = *(undefined1 (*) [16])(*pauVar4 + (long)stride * 2);
      auVar2 = *(undefined1 (*) [16])(*pauVar4 + (long)(stride * 2) * 2);
      auVar19 = pmaddwd(auVar18,auVar18);
      auVar3 = *(undefined1 (*) [16])(*pauVar4 + (long)(stride * 3) * 2);
      auVar20 = pmaddwd(auVar1,auVar1);
      auVar21 = pmaddwd(auVar2,auVar2);
      auVar14 = pmaddwd(auVar3,auVar3);
      uVar13 = auVar14._0_4_ + auVar21._0_4_ + auVar20._0_4_ + auVar19._0_4_ + uVar13;
      uVar15 = auVar14._4_4_ + auVar21._4_4_ + auVar20._4_4_ + auVar19._4_4_ + uVar15;
      uVar16 = auVar14._8_4_ + auVar21._8_4_ + auVar20._8_4_ + auVar19._8_4_ + uVar16;
      uVar17 = auVar14._12_4_ + auVar21._12_4_ + auVar20._12_4_ + auVar19._12_4_ + uVar17;
      auVar14._0_2_ = auVar1._0_2_ + auVar18._0_2_ + auVar2._0_2_ + auVar3._0_2_;
      auVar14._2_2_ = auVar1._2_2_ + auVar18._2_2_ + auVar2._2_2_ + auVar3._2_2_;
      auVar14._4_2_ = auVar1._4_2_ + auVar18._4_2_ + auVar2._4_2_ + auVar3._4_2_;
      auVar14._6_2_ = auVar1._6_2_ + auVar18._6_2_ + auVar2._6_2_ + auVar3._6_2_;
      auVar14._8_2_ = auVar1._8_2_ + auVar18._8_2_ + auVar2._8_2_ + auVar3._8_2_;
      auVar14._10_2_ = auVar1._10_2_ + auVar18._10_2_ + auVar2._10_2_ + auVar3._10_2_;
      auVar14._12_2_ = auVar1._12_2_ + auVar18._12_2_ + auVar2._12_2_ + auVar3._12_2_;
      auVar14._14_2_ = auVar1._14_2_ + auVar18._14_2_ + auVar2._14_2_ + auVar3._14_2_;
      auVar18 = pmaddwd(auVar14,_DAT_0046e8b0);
      iVar9 = iVar9 + auVar18._0_4_;
      iVar10 = iVar10 + auVar18._4_4_;
      iVar11 = iVar11 + auVar18._8_4_;
      iVar12 = iVar12 + auVar18._12_4_;
      lVar6 = lVar6 + 8;
      pauVar4 = pauVar4 + 1;
    } while (lVar6 < width);
    lVar7 = lVar7 + (ulong)uVar16 + (ulong)uVar13;
    lVar8 = lVar8 + (ulong)uVar17 + (ulong)uVar15;
    iVar5 = iVar5 + 4;
    src = (int16_t *)(*(undefined1 (*) [16])src + (long)(stride * 4) * 2);
  } while (iVar5 < height);
  *sum = *sum + iVar12 + iVar10 + iVar11 + iVar9;
  return lVar8 + lVar7;
}

Assistant:

__attribute__((noinline))
#endif
uint64_t
aom_sum_sse_2d_i16_nxn_sse2(const int16_t *src, int stride, int width,
                            int height, int *sum) {
  int r = 0;
  uint64_t result;
  const __m128i zero_reg = _mm_setzero_si128();
  const __m128i one_reg = _mm_set1_epi16(1);

  __m128i v_sse_total = zero_reg;
  __m128i v_sum_total = zero_reg;

  do {
    int c = 0;
    __m128i v_sse_row = zero_reg;
    do {
      const int16_t *b = src + c;

      __m128i v_val_0_w = xx_load_128(b + 0 * stride);
      __m128i v_val_1_w = xx_load_128(b + 1 * stride);
      __m128i v_val_2_w = xx_load_128(b + 2 * stride);
      __m128i v_val_3_w = xx_load_128(b + 3 * stride);

      const __m128i v_sq_0_d = _mm_madd_epi16(v_val_0_w, v_val_0_w);
      const __m128i v_sq_1_d = _mm_madd_epi16(v_val_1_w, v_val_1_w);
      const __m128i v_sq_2_d = _mm_madd_epi16(v_val_2_w, v_val_2_w);
      const __m128i v_sq_3_d = _mm_madd_epi16(v_val_3_w, v_val_3_w);
      const __m128i v_sq_01_d = _mm_add_epi32(v_sq_0_d, v_sq_1_d);
      const __m128i v_sq_23_d = _mm_add_epi32(v_sq_2_d, v_sq_3_d);
      const __m128i v_sq_0123_d = _mm_add_epi32(v_sq_01_d, v_sq_23_d);
      v_sse_row = _mm_add_epi32(v_sse_row, v_sq_0123_d);

      const __m128i v_sum_01 = _mm_add_epi16(v_val_0_w, v_val_1_w);
      const __m128i v_sum_23 = _mm_add_epi16(v_val_2_w, v_val_3_w);
      __m128i v_sum_0123_d = _mm_add_epi16(v_sum_01, v_sum_23);
      v_sum_0123_d = _mm_madd_epi16(v_sum_0123_d, one_reg);
      v_sum_total = _mm_add_epi32(v_sum_total, v_sum_0123_d);

      c += 8;
    } while (c < width);

    const __m128i v_sse_row_low = _mm_unpacklo_epi32(v_sse_row, zero_reg);
    const __m128i v_sse_row_hi = _mm_unpackhi_epi32(v_sse_row, zero_reg);
    v_sse_row = _mm_add_epi64(v_sse_row_low, v_sse_row_hi);
    v_sse_total = _mm_add_epi64(v_sse_total, v_sse_row);
    src += 4 * stride;
    r += 4;
  } while (r < height);

  v_sum_total = _mm_add_epi32(v_sum_total, _mm_srli_si128(v_sum_total, 8));
  v_sum_total = _mm_add_epi32(v_sum_total, _mm_srli_si128(v_sum_total, 4));
  *sum += _mm_cvtsi128_si32(v_sum_total);

  v_sse_total = _mm_add_epi64(v_sse_total, _mm_srli_si128(v_sse_total, 8));
  xx_storel_64(&result, v_sse_total);
  return result;
}